

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

SUNErrCode SUNLogger_CreateFromEnv(SUNComm comm,SUNLogger *logger_out)

{
  int iVar1;
  SUNErrCode SVar2;
  char *pcVar3;
  SUNLogger logger_00;
  SUNLogger *logger_ptr;
  undefined8 *in_RSI;
  char *debug_fname_env;
  char *info_fname_env;
  char *warning_fname_env;
  char *error_fname_env;
  int output_rank;
  char *output_rank_env;
  SUNLogger logger;
  SUNErrCode err;
  undefined4 in_stack_ffffffffffffffa8;
  SUNComm comm_00;
  int local_14;
  SUNErrCode local_4;
  
  pcVar3 = getenv("SUNLOGGER_OUTPUT_RANK");
  if (pcVar3 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(pcVar3);
  }
  getenv("SUNLOGGER_ERROR_FILENAME");
  pcVar3 = getenv("SUNLOGGER_WARNING_FILENAME");
  comm_00 = (SUNComm)pcVar3;
  logger_00 = (SUNLogger)getenv("SUNLOGGER_INFO_FILENAME");
  logger_ptr = (SUNLogger *)getenv("SUNLOGGER_DEBUG_FILENAME");
  SVar2 = SUNLogger_Create(comm_00,(int)((ulong)logger_00 >> 0x20),logger_ptr);
  if (SVar2 == 0) {
    local_14 = SUNLogger_SetErrorFilename(logger_00,(char *)logger_ptr);
    if (((local_14 == 0) &&
        (local_14 = SUNLogger_SetWarningFilename(logger_00,(char *)logger_ptr), local_14 == 0)) &&
       (local_14 = SUNLogger_SetDebugFilename
                             ((SUNLogger)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)0x112730)
       , local_14 == 0)) {
      local_14 = SUNLogger_SetInfoFilename
                           ((SUNLogger)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)0x11274c);
    }
    if (local_14 == 0) {
      *in_RSI = 0;
    }
    else {
      SUNLogger_Destroy((SUNLogger *)logger_00);
    }
    local_4 = local_14;
  }
  else {
    local_4 = -0x2709;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNLogger_CreateFromEnv(SUNComm comm, SUNLogger* logger_out)
{
  SUNErrCode err   = SUN_SUCCESS;
  SUNLogger logger = NULL;

  const char* output_rank_env   = getenv("SUNLOGGER_OUTPUT_RANK");
  int output_rank               = (output_rank_env) ? atoi(output_rank_env) : 0;
  const char* error_fname_env   = getenv("SUNLOGGER_ERROR_FILENAME");
  const char* warning_fname_env = getenv("SUNLOGGER_WARNING_FILENAME");
  const char* info_fname_env    = getenv("SUNLOGGER_INFO_FILENAME");
  const char* debug_fname_env   = getenv("SUNLOGGER_DEBUG_FILENAME");

  if (SUNLogger_Create(comm, output_rank, &logger))
  {
    err = SUN_ERR_CORRUPT;
    return err;
  }

  do {
    err = SUNLogger_SetErrorFilename(logger, error_fname_env);
    if (err) { break; }
    err = SUNLogger_SetWarningFilename(logger, warning_fname_env);
    if (err) { break; }
    err = SUNLogger_SetDebugFilename(logger, debug_fname_env);
    if (err) { break; }
    err = SUNLogger_SetInfoFilename(logger, info_fname_env);
  }
  while (0);

  if (err) { SUNLogger_Destroy(&logger); }
  else { *logger_out = logger; }

  return err;
}